

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O3

BOOL TryEnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  bool bVar1;
  CPalThread *pThread;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    bVar1 = CorUnix::InternalTryEnterCriticalSection(pThread,lpCriticalSection);
    if (PAL_InitializeChakraCoreCalled != false) {
      return (BOOL)bVar1;
    }
  }
  abort();
}

Assistant:

BOOL TryEnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(TryEnterCriticalSection);
    ENTRY("TryEnterCriticalSection(lpCriticalSection=%p)\n", lpCriticalSection);

    CPalThread * pThread = InternalGetCurrentThread();

    bool fRet = InternalTryEnterCriticalSection(pThread,
        lpCriticalSection);

    LOGEXIT("TryEnterCriticalSection returns bool %d\n", (int)fRet);
    PERF_EXIT(TryEnterCriticalSection);

    return (BOOL)fRet;
}